

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettywriter.h
# Opt level: O2

void __thiscall
rapidjson::
PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::PrettyPrefix(PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
               *this,Type type)

{
  char *pcVar1;
  Ch c;
  undefined1 uVar2;
  Ch c_00;
  bool bVar3;
  
  pcVar1 = (this->
           super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
           ).level_stack_.stackTop_;
  if (pcVar1 == (this->
                super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                ).level_stack_.stack_) {
    (this->
    super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ).hasRoot_ = true;
    return;
  }
  if (pcVar1[-8] == '\x01') {
    uVar2 = type - kStringType < 0xfffffffe & (char)this->formatOptions_;
    pcVar1[-7] = uVar2;
    if (*(long *)(pcVar1 + -0x10) != 0) {
      GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put
                ((this->
                 super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                 ).os_,',');
      uVar2 = pcVar1[-7];
      if (uVar2 == kFormatSingleLineArray) {
        GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put
                  ((this->
                   super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                   ).os_,' ');
        uVar2 = pcVar1[-7];
      }
    }
    if ((uVar2 & kFormatSingleLineArray) != kFormatDefault) goto LAB_0015f731;
    GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put
              ((this->
               super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
               ).os_,'\n');
  }
  else {
    if (*(ulong *)(pcVar1 + -0x10) == 0) {
      c_00 = '\n';
    }
    else {
      bVar3 = (*(ulong *)(pcVar1 + -0x10) & 1) == 0;
      c_00 = ' ';
      if (bVar3) {
        c_00 = '\n';
      }
      c = ':';
      if (bVar3) {
        c = ',';
      }
      GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put
                ((this->
                 super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                 ).os_,c);
    }
    GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put
              ((this->
               super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
               ).os_,c_00);
    if ((pcVar1[-0x10] & 1U) != 0) goto LAB_0015f731;
  }
  WriteIndent(this);
LAB_0015f731:
  *(long *)(pcVar1 + -0x10) = *(long *)(pcVar1 + -0x10) + 1;
  return;
}

Assistant:

void PrettyPrefix(Type type) {
        (void)type;
        if (Base::level_stack_.GetSize() != 0) { // this value is not at root
            typename Base::Level* level = Base::level_stack_.template Top<typename Base::Level>();

            if (level->inArray) {
                level->inLine = (formatOptions_ & kFormatSingleLineArray) && type != kObjectType && type != kArrayType;

                if (level->valueCount > 0) {
                    Base::os_->Put(','); // add comma if it is not the first element in array
                    if (level->inLine) {
                        Base::os_->Put(' ');
                    }
                }

                if (!level->inLine) {
                    Base::os_->Put('\n');
                    WriteIndent();
                }
            }
            else {  // in object
                if (level->valueCount > 0) {
                    if (level->valueCount % 2 == 0) {
                        Base::os_->Put(',');
                        Base::os_->Put('\n');
                    }
                    else {
                        Base::os_->Put(':');
                        Base::os_->Put(' ');
                    }
                }
                else
                    Base::os_->Put('\n');

                if (level->valueCount % 2 == 0)
                    WriteIndent();
            }
            if (!level->inArray && level->valueCount % 2 == 0)
                RAPIDJSON_ASSERT(type == kStringType);  // if it's in object, then even number should be a name
            level->valueCount++;
        }
        else {
            RAPIDJSON_ASSERT(!Base::hasRoot_);  // Should only has one and only one root.
            Base::hasRoot_ = true;
        }
    }